

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int amqpvalue_get_begin(AMQP_VALUE value,BEGIN_HANDLE *begin_handle)

{
  bool bVar1;
  int iVar2;
  AMQP_TYPE AVar3;
  int iVar4;
  BEGIN_HANDLE pBVar5;
  AMQP_VALUE pAVar6;
  AMQP_VALUE pAVar7;
  uint32_t list_item_count;
  uint16_t remote_channel;
  AMQP_VALUE offered_capabilities_array;
  int local_48;
  uint local_44;
  AMQP_VALUE local_40;
  AMQP_VALUE local_38;
  
  pBVar5 = (BEGIN_HANDLE)malloc(8);
  if (pBVar5 == (BEGIN_HANDLE)0x0) {
    *begin_handle = (BEGIN_HANDLE)0x0;
    iVar4 = 0x91b;
  }
  else {
    pBVar5->composite_value = (AMQP_VALUE)0x0;
    *begin_handle = pBVar5;
    pAVar6 = amqpvalue_get_inplace_described_value(value);
    if (pAVar6 == (AMQP_VALUE)0x0) {
      begin_destroy(*begin_handle);
      iVar4 = 0x923;
    }
    else {
      iVar2 = amqpvalue_get_list_item_count(pAVar6,&local_44);
      iVar4 = 0x92a;
      if (iVar2 == 0) {
        if ((local_44 != 0) &&
           (pAVar7 = amqpvalue_get_list_item(pAVar6,0), pAVar7 != (AMQP_VALUE)0x0)) {
          AVar3 = amqpvalue_get_type(pAVar7);
          if ((AVar3 != AMQP_TYPE_NULL) &&
             (iVar4 = amqpvalue_get_ushort(pAVar7,(uint16_t *)&local_40), iVar4 != 0)) {
            amqpvalue_destroy(pAVar7);
            begin_destroy(*begin_handle);
            return 0x946;
          }
          amqpvalue_destroy(pAVar7);
        }
        iVar4 = 0x974;
        if (1 < local_44) {
          pAVar7 = amqpvalue_get_list_item(pAVar6,1);
          if (pAVar7 == (AMQP_VALUE)0x0) {
            begin_destroy(*begin_handle);
            iVar4 = 0x956;
          }
          else {
            AVar3 = amqpvalue_get_type(pAVar7);
            if (AVar3 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(pAVar7);
              begin_destroy(*begin_handle);
              iVar4 = 0x960;
            }
            else {
              iVar4 = amqpvalue_get_uint(pAVar7,(uint32_t *)&local_40);
              if (iVar4 == 0) {
                amqpvalue_destroy(pAVar7);
                iVar4 = 0x99d;
                if (2 < local_44) {
                  pAVar7 = amqpvalue_get_list_item(pAVar6,2);
                  if (pAVar7 == (AMQP_VALUE)0x0) {
                    begin_destroy(*begin_handle);
                    iVar4 = 0x97f;
                  }
                  else {
                    AVar3 = amqpvalue_get_type(pAVar7);
                    if (AVar3 == AMQP_TYPE_NULL) {
                      amqpvalue_destroy(pAVar7);
                      begin_destroy(*begin_handle);
                      iVar4 = 0x989;
                    }
                    else {
                      iVar4 = amqpvalue_get_uint(pAVar7,(uint32_t *)&local_40);
                      if (iVar4 == 0) {
                        local_48 = 0x946;
                        amqpvalue_destroy(pAVar7);
                        iVar4 = 0x9c6;
                        if (3 < local_44) {
                          pAVar7 = amqpvalue_get_list_item(pAVar6,3);
                          if (pAVar7 == (AMQP_VALUE)0x0) {
                            begin_destroy(*begin_handle);
                            iVar4 = 0x9a8;
                          }
                          else {
                            AVar3 = amqpvalue_get_type(pAVar7);
                            if (AVar3 == AMQP_TYPE_NULL) {
                              amqpvalue_destroy(pAVar7);
                              begin_destroy(*begin_handle);
                              iVar4 = 0x9b2;
                            }
                            else {
                              iVar4 = amqpvalue_get_uint(pAVar7,(uint32_t *)&local_40);
                              if (iVar4 == 0) {
                                amqpvalue_destroy(pAVar7);
                                if ((4 < local_44) &&
                                   (pAVar7 = amqpvalue_get_list_item(pAVar6,4),
                                   pAVar7 != (AMQP_VALUE)0x0)) {
                                  AVar3 = amqpvalue_get_type(pAVar7);
                                  if ((AVar3 != AMQP_TYPE_NULL) &&
                                     (iVar4 = amqpvalue_get_uint(pAVar7,(uint32_t *)&local_40),
                                     iVar4 != 0)) {
                                    amqpvalue_destroy(pAVar7);
                                    begin_destroy(*begin_handle);
                                    return 0x9de;
                                  }
                                  amqpvalue_destroy(pAVar7);
                                }
                                if ((5 < local_44) &&
                                   (pAVar7 = amqpvalue_get_list_item(pAVar6,5),
                                   pAVar7 != (AMQP_VALUE)0x0)) {
                                  AVar3 = amqpvalue_get_type(pAVar7);
                                  if (AVar3 != AMQP_TYPE_NULL) {
                                    local_40 = (AMQP_VALUE)0x0;
                                    AVar3 = amqpvalue_get_type(pAVar7);
                                    if (((AVar3 == AMQP_TYPE_ARRAY) &&
                                        (iVar4 = amqpvalue_get_array(pAVar7,&local_38), iVar4 == 0))
                                       || (iVar4 = amqpvalue_get_symbol(pAVar7,(char **)&local_40),
                                          iVar4 == 0)) {
                                      bVar1 = true;
                                    }
                                    else {
                                      amqpvalue_destroy(pAVar7);
                                      begin_destroy(*begin_handle);
                                      local_48 = 0x9fd;
                                      bVar1 = false;
                                    }
                                    if (!bVar1) {
                                      return local_48;
                                    }
                                  }
                                  amqpvalue_destroy(pAVar7);
                                }
                                if ((6 < local_44) &&
                                   (pAVar7 = amqpvalue_get_list_item(pAVar6,6),
                                   pAVar7 != (AMQP_VALUE)0x0)) {
                                  AVar3 = amqpvalue_get_type(pAVar7);
                                  if (AVar3 != AMQP_TYPE_NULL) {
                                    local_40 = (AMQP_VALUE)0x0;
                                    AVar3 = amqpvalue_get_type(pAVar7);
                                    if (((AVar3 == AMQP_TYPE_ARRAY) &&
                                        (iVar4 = amqpvalue_get_array(pAVar7,&local_38), iVar4 == 0))
                                       || (iVar4 = amqpvalue_get_symbol(pAVar7,(char **)&local_40),
                                          iVar4 == 0)) {
                                      bVar1 = true;
                                    }
                                    else {
                                      amqpvalue_destroy(pAVar7);
                                      begin_destroy(*begin_handle);
                                      local_48 = 0xa1c;
                                      bVar1 = false;
                                    }
                                    if (!bVar1) {
                                      return local_48;
                                    }
                                  }
                                  amqpvalue_destroy(pAVar7);
                                }
                                if ((7 < local_44) &&
                                   (pAVar6 = amqpvalue_get_list_item(pAVar6,7),
                                   pAVar6 != (AMQP_VALUE)0x0)) {
                                  AVar3 = amqpvalue_get_type(pAVar6);
                                  if ((AVar3 != AMQP_TYPE_NULL) &&
                                     (iVar4 = amqpvalue_get_map(pAVar6,&local_40), iVar4 != 0)) {
                                    amqpvalue_destroy(pAVar6);
                                    begin_destroy(*begin_handle);
                                    return 0xa39;
                                  }
                                  amqpvalue_destroy(pAVar6);
                                }
                                pAVar6 = amqpvalue_clone(value);
                                pBVar5->composite_value = pAVar6;
                                iVar4 = 0;
                              }
                              else {
                                amqpvalue_destroy(pAVar7);
                                begin_destroy(*begin_handle);
                                iVar4 = 0x9bc;
                              }
                            }
                          }
                        }
                      }
                      else {
                        amqpvalue_destroy(pAVar7);
                        begin_destroy(*begin_handle);
                        iVar4 = 0x993;
                      }
                    }
                  }
                }
              }
              else {
                amqpvalue_destroy(pAVar7);
                begin_destroy(*begin_handle);
                iVar4 = 0x96a;
              }
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int amqpvalue_get_begin(AMQP_VALUE value, BEGIN_HANDLE* begin_handle)
{
    int result;
    BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin_create_internal();
    *begin_handle = begin_instance;
    if (*begin_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            begin_destroy(*begin_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* remote-channel */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint16_t remote_channel;
                                if (amqpvalue_get_ushort(item_value, &remote_channel) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* next-outgoing-id */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            {
                                begin_destroy(*begin_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                begin_destroy(*begin_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                transfer_number next_outgoing_id;
                                if (amqpvalue_get_transfer_number(item_value, &next_outgoing_id) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* incoming-window */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            {
                                begin_destroy(*begin_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                begin_destroy(*begin_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                uint32_t incoming_window;
                                if (amqpvalue_get_uint(item_value, &incoming_window) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* outgoing-window */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            {
                                begin_destroy(*begin_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                begin_destroy(*begin_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                uint32_t outgoing_window;
                                if (amqpvalue_get_uint(item_value, &outgoing_window) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* handle-max */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                handle handle_max;
                                if (amqpvalue_get_handle(item_value, &handle_max) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* offered-capabilities */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* offered_capabilities = NULL;
                                AMQP_VALUE offered_capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &offered_capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &offered_capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* desired-capabilities */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* desired_capabilities = NULL;
                                AMQP_VALUE desired_capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &desired_capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &desired_capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* properties */
                    if (list_item_count > 7)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 7);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                fields properties;
                                if (amqpvalue_get_fields(item_value, &properties) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    begin_destroy(*begin_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    begin_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}